

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Default_AST_Node::eval_internal(Default_AST_Node *this,Dispatch_State *t_ss)

{
  AST_Node *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Dispatch_State *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar1;
  Scope_Push_Pop spp;
  Scope_Push_Pop *in_stack_ffffffffffffffc0;
  Dispatch_State *in_stack_ffffffffffffffe0;
  
  eval::detail::Scope_Push_Pop::Scope_Push_Pop(in_stack_ffffffffffffffc0,in_RSI);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 3),0);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x270a42);
  AST_Node::eval(in_RDX,in_stack_ffffffffffffffe0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x270a60);
  Boxed_Value::Boxed_Value((Boxed_Value *)0x270a69);
  eval::detail::Scope_Push_Pop::~Scope_Push_Pop((Scope_Push_Pop *)in_RDI);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          children[0]->eval(t_ss);

          return Boxed_Value();
        }